

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetType.cpp
# Opt level: O0

void slang::ast::validateResolver
               (NetType *netType,SubroutineSymbol *resolver,SourceRange range,ASTContext *context)

{
  SourceRange sourceRange;
  SourceRange range_00;
  string_view arg;
  string_view arg_00;
  bool bVar1;
  size_type sVar2;
  Symbol *pSVar3;
  reference ppFVar4;
  Diagnostic *this;
  Symbol *in_RSI;
  NetType *in_RDI;
  SourceLocation in_R8;
  Diagnostic *diag;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  driverRange;
  Scope *resolverParent;
  Type *argType;
  Type *retType;
  ArgList args;
  anon_class_32_4_e1954f7e reportError;
  Type *netTypeType;
  SubroutineSymbol *in_stack_fffffffffffffdd8;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  *in_stack_fffffffffffffde0;
  Type *in_stack_fffffffffffffde8;
  const_iterator *in_stack_fffffffffffffdf0;
  SourceLocation SVar5;
  undefined4 in_stack_fffffffffffffe14;
  DiagCode code;
  anon_class_32_4_e1954f7e *in_stack_fffffffffffffe18;
  anon_class_32_4_e1954f7e *this_00;
  undefined4 in_stack_fffffffffffffe20;
  DiagCode in_stack_fffffffffffffe24;
  Type *in_stack_fffffffffffffe28;
  Diagnostic *in_stack_fffffffffffffe30;
  DeclaredType *in_stack_fffffffffffffe50;
  Type *in_stack_fffffffffffffe90;
  Type *in_stack_fffffffffffffe98;
  SubroutineSymbol *in_stack_fffffffffffffea8;
  ValueSymbol *in_stack_fffffffffffffec8;
  undefined1 local_120 [134];
  undefined4 local_9a;
  undefined4 local_96;
  undefined4 local_92;
  undefined4 local_8e;
  bitmask<slang::ast::MethodFlags> local_8a;
  Scope *local_88;
  undefined4 local_7c;
  Type *local_78;
  Type *local_70;
  undefined4 local_64;
  ArgList local_60;
  SourceLocation local_50;
  undefined1 *local_48;
  NetType *local_40;
  Symbol *local_38;
  Type *local_30;
  SourceLocation local_28;
  Symbol *local_20;
  NetType *local_18;
  undefined1 local_10 [16];
  
  local_28 = in_R8;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_30 = DeclaredType::getType(in_stack_fffffffffffffe50);
  bVar1 = NetType::isError(local_18);
  if ((!bVar1) && (bVar1 = Type::isError((Type *)0x10f0806), !bVar1)) {
    local_50 = local_28;
    local_48 = local_10;
    local_40 = local_18;
    local_38 = local_20;
    local_60 = SubroutineSymbol::getArguments(in_stack_fffffffffffffdd8);
    sVar2 = std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                        *)0x10f087b);
    if (sVar2 == 1) {
      local_70 = SubroutineSymbol::getReturnType((SubroutineSymbol *)0x10f08c4);
      std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::operator[]
                (&local_60,0);
      ValueSymbol::getType((ValueSymbol *)0x10f08e5);
      local_78 = Type::getCanonicalType((Type *)in_stack_fffffffffffffde0);
      bVar1 = Type::isError((Type *)0x10f0902);
      if ((!bVar1) && (bVar1 = Type::isError((Type *)0x10f0913), !bVar1)) {
        if (*(int *)((long)&local_20[2].originatingSyntax + 4) == 0) {
          local_88 = Symbol::getParentScope(local_20);
          this_00 = (anon_class_32_4_e1954f7e *)&local_20[3].field_0x4;
          bitmask<slang::ast::MethodFlags>::bitmask(&local_8a,Static);
          bVar1 = bitmask<slang::ast::MethodFlags>::has
                            ((bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffde0,
                             (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffdd8);
          in_stack_fffffffffffffe24 = (DiagCode)((uint)in_stack_fffffffffffffe24 & 0xffffff);
          if (!bVar1) {
            pSVar3 = Scope::asSymbol(local_88);
            in_stack_fffffffffffffe24.code._1_1_ = pSVar3->kind == ClassType;
          }
          if (in_stack_fffffffffffffe24.code._1_1_ == '\0') {
            bVar1 = bitmask<slang::ast::MethodFlags>::operator==
                              ((bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffde0,
                               (MethodFlags)((ulong)in_stack_fffffffffffffdd8 >> 0x30));
            if ((((bVar1 ^ 0xffU) & 1) == 0) ||
               (bVar1 = bitmask<slang::ast::MethodFlags>::operator==
                                  ((bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffde0,
                                   (MethodFlags)((ulong)in_stack_fffffffffffffdd8 >> 0x30)),
               ((bVar1 ^ 0xffU) & 1) == 0)) {
              bVar1 = Type::isMatching(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
              if (bVar1) {
                if (((local_78->super_Symbol).kind == DynamicArrayType) &&
                   (ppFVar4 = std::
                              span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                              ::operator[](&local_60,0), (*ppFVar4)->direction == In)) {
                  Type::getArrayElementType(in_stack_fffffffffffffde8);
                  bVar1 = Type::isMatching(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
                  if (bVar1) {
                    SubroutineSymbol::getBody(in_stack_fffffffffffffea8);
                    std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                    ::operator[](&local_60,0);
                    SVar5 = (SourceLocation)local_120;
                    ValueSymbol::drivers(in_stack_fffffffffffffec8);
                    bVar1 = std::ranges::
                            subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                            ::empty((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                                     *)0x10f0b69);
                    code._0_3_ = (undefined3)in_stack_fffffffffffffe14;
                    code.code._1_1_ = bVar1;
                    if (!bVar1) {
                      std::ranges::
                      subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                      ::begin((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                               *)in_stack_fffffffffffffdd8);
                      this = (Diagnostic *)
                             IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::
                             const_iterator::operator*(in_stack_fffffffffffffdf0);
                      ValueDriver::getSourceRange((ValueDriver *)in_stack_fffffffffffffde0);
                      sourceRange.endLoc = SVar5;
                      sourceRange.startLoc = local_28;
                      in_stack_fffffffffffffde0 =
                           (subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                            *)ASTContext::addDiag((ASTContext *)this,code,sourceRange);
                      IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::
                      const_iterator::~const_iterator((const_iterator *)0x10f0c28);
                      arg._M_str = (char *)in_stack_fffffffffffffe30;
                      arg._M_len = (size_t)in_stack_fffffffffffffe28;
                      Diagnostic::operator<<
                                ((Diagnostic *)
                                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),arg);
                      std::
                      span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
                      operator[](&local_60,0);
                      arg_00._M_str = (char *)in_stack_fffffffffffffe30;
                      arg_00._M_len = (size_t)in_stack_fffffffffffffe28;
                      Diagnostic::operator<<
                                ((Diagnostic *)
                                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                                 arg_00);
                      range_00.endLoc = SVar5;
                      range_00.startLoc = local_28;
                      Diagnostic::addNote(this,code,range_00);
                    }
                    std::ranges::
                    subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                    ::~subrange(in_stack_fffffffffffffde0);
                    return;
                  }
                }
                local_9a = 0x150009;
                validateResolver::anon_class_32_4_e1954f7e::operator()
                          (this_00,in_stack_fffffffffffffe24);
                operator<<(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
              }
              else {
                local_96 = 0x140009;
                validateResolver::anon_class_32_4_e1954f7e::operator()
                          (this_00,in_stack_fffffffffffffe24);
                operator<<(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
              }
            }
            else {
              local_92 = 0x170009;
              validateResolver::anon_class_32_4_e1954f7e::operator()
                        (this_00,in_stack_fffffffffffffe24);
            }
          }
          else {
            local_8e = 0x130009;
            validateResolver::anon_class_32_4_e1954f7e::operator()
                      (this_00,in_stack_fffffffffffffe24);
          }
        }
        else {
          local_7c = 0x160009;
          validateResolver::anon_class_32_4_e1954f7e::operator()
                    (in_stack_fffffffffffffe18,in_stack_fffffffffffffe24);
        }
      }
    }
    else {
      local_64 = 0x150009;
      validateResolver::anon_class_32_4_e1954f7e::operator()
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe24);
      operator<<(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
  }
  return;
}

Assistant:

static void validateResolver(const NetType& netType, const SubroutineSymbol& resolver,
                             SourceRange range, const ASTContext& context) {
    auto& netTypeType = netType.declaredType.getType();
    if (netType.isError() || netTypeType.isError())
        return;

    auto reportError = [&](DiagCode code) -> Diagnostic& {
        auto& diag = context.addDiag(code, range);
        diag << netType.name;
        diag.addNote(diag::NoteDeclarationHere, resolver.location);
        return diag;
    };

    auto args = resolver.getArguments();
    if (args.size() != 1) {
        reportError(diag::NTResolveSingleArg) << netTypeType;
        return;
    }

    auto& retType = resolver.getReturnType();
    auto& argType = args[0]->getType().getCanonicalType();
    if (retType.isError() || argType.isError())
        return;

    if (resolver.subroutineKind != SubroutineKind::Function) {
        reportError(diag::NTResolveTask);
        return;
    }

    auto resolverParent = resolver.getParentScope();
    SLANG_ASSERT(resolverParent);
    if (!resolver.flags.has(MethodFlags::Static) &&
        resolverParent->asSymbol().kind == SymbolKind::ClassType) {
        reportError(diag::NTResolveClass);
        return;
    }

    if (resolver.flags != MethodFlags::None && resolver.flags != MethodFlags::Static) {
        reportError(diag::NTResolveUserDef);
        return;
    }

    if (!netTypeType.isMatching(retType)) {
        reportError(diag::NTResolveReturn) << netTypeType;
        return;
    }

    if (argType.kind != SymbolKind::DynamicArrayType ||
        args[0]->direction != ArgumentDirection::In ||
        !argType.getArrayElementType()->isMatching(netTypeType)) {
        reportError(diag::NTResolveSingleArg) << netTypeType;
        return;
    }

    resolver.getBody();

    auto driverRange = args[0]->drivers();
    if (!driverRange.empty()) {
        auto& diag = context.addDiag(diag::NTResolveArgModify,
                                     (*driverRange.begin())->getSourceRange());
        diag << netType.name << args[0]->name;
        diag.addNote(diag::NoteReferencedHere, range);
    }
}